

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_stdin(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b_1;
  int64_t eval_a_1;
  uv_buf_t buf;
  char buffer [23];
  uv_stdio_container_t stdio [2];
  uv_write_t write_req;
  uv_pipe_t in;
  uv_pipe_t out;
  
  builtin_strncpy(buffer,"hello-from-spawn_stdin",0x17);
  init_process_options("spawn_helper3",exit_cb);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,&out,0);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,&in,0);
  options.stdio = stdio;
  stdio[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  stdio[1].flags = UV_WRITABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 2;
  stdio[0].data.stream = (uv_stream_t *)&in;
  stdio[1].data.stream = (uv_stream_t *)&out;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  eval_a_1 = (int64_t)iVar1;
  buf.base = (char *)0x0;
  write_req.data = (void *)eval_a_1;
  if ((void *)eval_a_1 == (void *)0x0) {
    buf.base = buffer;
    buf.len = 0x17;
    iVar1 = uv_write(&write_req,(uv_stream_t *)&in,&buf,1,write_cb);
    eval_a_1 = (int64_t)iVar1;
    eval_b_1 = 0;
    if ((void *)eval_a_1 == (void *)0x0) {
      iVar1 = uv_read_start((uv_stream_t *)&out,on_alloc,on_read);
      eval_a_1 = (int64_t)iVar1;
      eval_b_1 = 0;
      if ((void *)eval_a_1 == (void *)0x0) {
        puVar2 = uv_default_loop();
        iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
        eval_a_1 = (int64_t)iVar1;
        eval_b_1 = 0;
        if ((void *)eval_a_1 == (void *)0x0) {
          eval_a_1 = 1;
          eval_b_1 = (int64_t)exit_cb_called;
          if (eval_b_1 == 1) {
            eval_a_1 = 3;
            eval_b_1 = (int64_t)close_cb_called;
            if (eval_b_1 == 3) {
              iVar1 = strcmp(buffer,output);
              eval_a_1 = (int64_t)iVar1;
              eval_b_1 = 0;
              if ((void *)eval_a_1 == (void *)0x0) {
                puVar2 = uv_default_loop();
                close_loop(puVar2);
                eval_a_1 = 0;
                puVar2 = uv_default_loop();
                iVar1 = uv_loop_close(puVar2);
                eval_b_1 = (int64_t)iVar1;
                if (eval_b_1 == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar5 = "uv_loop_close(uv_default_loop())";
                pcVar4 = "0";
                uVar3 = 0x273;
              }
              else {
                pcVar5 = "0";
                pcVar4 = "strcmp(buffer, output)";
                uVar3 = 0x271;
              }
            }
            else {
              pcVar5 = "close_cb_called";
              pcVar4 = "3";
              uVar3 = 0x270;
            }
          }
          else {
            pcVar5 = "exit_cb_called";
            pcVar4 = "1";
            uVar3 = 0x26f;
          }
        }
        else {
          pcVar5 = "0";
          pcVar4 = "r";
          uVar3 = 0x26d;
        }
      }
      else {
        pcVar5 = "0";
        pcVar4 = "r";
        uVar3 = 0x26a;
      }
    }
    else {
      pcVar5 = "0";
      pcVar4 = "r";
      uVar3 = 0x267;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "r";
    uVar3 = 0x262;
    eval_b_1 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a_1,"==",eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(spawn_stdin) {
  int r;
  uv_pipe_t out;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  char buffer[] = "hello-from-spawn_stdin";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  buf.base = buffer;
  buf.len = sizeof(buffer);
  r = uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(3, close_cb_called); /* Once for process twice for the pipe. */
  ASSERT_OK(strcmp(buffer, output));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}